

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderView::swapSections(QHeaderView *this,int first,int second)

{
  HeaderMode HVar1;
  QHeaderViewPrivate *this_00;
  long lVar2;
  Data *pDVar3;
  int iVar4;
  pointer piVar5;
  pointer pSVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ResizeMode mode;
  uint uVar10;
  ResizeMode mode_00;
  long in_FS_OFFSET;
  int local_90;
  int local_8c;
  int local_64;
  int local_60;
  int local_5c;
  void *local_58;
  int *piStack_50;
  int *local_48;
  int *piStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (first != second) {
    this_00 = *(QHeaderViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
       ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout
                (&this_00->super_QAbstractItemViewPrivate);
      (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    if (-1 < first) {
      HVar1 = this_00->headerMode;
      if (HVar1 == InitialNoSectionMemoryUsage) {
        iVar4 = (int)this_00->countInNoSectionItemsMode;
      }
      else {
        iVar4 = (int)(this_00->sectionItems).d.size;
      }
      if ((-1 < second) && (first < iVar4)) {
        if (HVar1 == InitialNoSectionMemoryUsage) {
          iVar4 = (int)this_00->countInNoSectionItemsMode;
        }
        else {
          iVar4 = (int)(this_00->sectionItems).d.size;
        }
        if (second < iVar4) {
          if (HVar1 == InitialNoSectionMemoryUsage) {
            QHeaderViewPrivate::setHeaderMode(this_00,FlexibleWithSectionMemoryUsage);
          }
          uVar9 = (ulong)(uint)first;
          if (this_00->headerMode == InitialNoSectionMemoryUsage) {
            uVar7 = this_00->defaultSectionSize;
          }
          else {
            uVar7 = 0xffffffff;
            if (first < (int)(this_00->sectionItems).d.size) {
              uVar7 = *(uint *)((this_00->sectionItems).d.ptr + uVar9) & 0xfffff;
            }
          }
          if (uVar9 < (ulong)(this_00->sectionItems).d.size) {
            mode = *(uint *)((this_00->sectionItems).d.ptr + uVar9) >> 0x15 & 0x1f;
          }
          else {
            mode = this_00->globalResizeMode;
          }
          lVar2 = (this_00->logicalIndices).d.size;
          local_8c = first;
          if (lVar2 != 0) {
            local_8c = (this_00->logicalIndices).d.ptr[uVar9];
          }
          uVar8 = (ulong)(uint)second;
          if (this_00->headerMode == InitialNoSectionMemoryUsage) {
            uVar10 = this_00->defaultSectionSize;
          }
          else {
            uVar10 = 0xffffffff;
            if ((-1 < second) && (second < (int)(this_00->sectionItems).d.size)) {
              uVar10 = *(uint *)((this_00->sectionItems).d.ptr + uVar8) & 0xfffff;
            }
          }
          if (uVar8 < (ulong)(this_00->sectionItems).d.size) {
            mode_00 = *(uint *)((this_00->sectionItems).d.ptr + uVar8) >> 0x15 & 0x1f;
          }
          else {
            mode_00 = this_00->globalResizeMode;
          }
          local_90 = second;
          if (lVar2 != 0) {
            local_90 = (this_00->logicalIndices).d.ptr[uVar8];
          }
          if (this_00->state == ResizeSection) {
            this_00->preventCursorChangeInSetOffset = true;
          }
          QHeaderViewPrivate::createSectionItems(this_00,second,second,uVar7,mode);
          QHeaderViewPrivate::createSectionItems(this_00,first,first,uVar10,mode_00);
          QHeaderViewPrivate::initializeIndexMapping(this_00);
          piVar5 = QList<int>::data(&this_00->visualIndices);
          piVar5[local_8c] = second;
          piVar5 = QList<int>::data(&this_00->logicalIndices);
          piVar5[uVar8] = local_8c;
          piVar5 = QList<int>::data(&this_00->visualIndices);
          piVar5[local_90] = first;
          piVar5 = QList<int>::data(&this_00->logicalIndices);
          piVar5[uVar9] = local_90;
          pDVar3 = (this_00->hiddenSectionSize).d;
          if ((pDVar3 != (Data *)0x0) && (pDVar3->size != 0)) {
            uVar10 = 0;
            uVar7 = 0;
            if (this_00->headerMode != InitialNoSectionMemoryUsage) {
              uVar7 = *(uint *)((this_00->sectionItems).d.ptr + uVar9) & 0x100000;
              uVar10 = *(uint *)((this_00->sectionItems).d.ptr + uVar8) & 0x100000;
            }
            pSVar6 = QList<QHeaderViewPrivate::SectionItem>::data(&this_00->sectionItems);
            *(uint *)(pSVar6 + uVar9) = *(uint *)(pSVar6 + uVar9) & 0xffefffff | uVar10;
            pSVar6 = QList<QHeaderViewPrivate::SectionItem>::data(&this_00->sectionItems);
            *(uint *)(pSVar6 + uVar8) = *(uint *)(pSVar6 + uVar8) & 0xffefffff | uVar7;
          }
          QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                          .viewport);
          piStack_50 = &local_5c;
          local_5c = local_8c;
          local_48 = &local_60;
          local_58 = (void *)0x0;
          local_64 = second;
          local_60 = first;
          piStack_40 = &local_64;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
          piStack_50 = &local_5c;
          local_5c = local_90;
          local_48 = &local_60;
          local_58 = (void *)0x0;
          local_64 = first;
          local_60 = second;
          piStack_40 = &local_64;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
          if ((*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x5ec) == '\x01') &&
             (iVar4 = visualIndex(this,this_00->lastSectionLogicalIdx),
             iVar4 <= first || iVar4 <= second)) {
            QHeaderViewPrivate::maybeRestorePrevLastSectionAndStretchLast(this_00);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::swapSections(int first, int second)
{
    Q_D(QHeaderView);

    if (first == second)
        return;
    d->executePostedLayout();
    if (first < 0 || first >= d->sectionCount() || second < 0 || second >= d->sectionCount())
        return;

    if (d->noSectionMemoryUsage())
        d->switchToFlexibleModeWithSectionMemoryUsage();

    int firstSize = d->headerSectionSize(first);
    ResizeMode firstMode = d->headerSectionResizeMode(first);
    int firstLogical = d->logicalIndex(first);

    int secondSize = d->headerSectionSize(second);
    ResizeMode secondMode = d->headerSectionResizeMode(second);
    int secondLogical = d->logicalIndex(second);

    if (d->state == QHeaderViewPrivate::ResizeSection)
        d->preventCursorChangeInSetOffset = true;

    d->createSectionItems(second, second, firstSize, firstMode);
    d->createSectionItems(first, first, secondSize, secondMode);

    d->initializeIndexMapping();

    d->visualIndices[firstLogical] = second;
    d->logicalIndices[second] = firstLogical;

    d->visualIndices[secondLogical] = first;
    d->logicalIndices[first] = secondLogical;

    if (!d->hiddenSectionSize.isEmpty()) {
        bool firstHidden = d->isVisualIndexHidden(first);
        bool secondHidden = d->isVisualIndexHidden(second);
        d->setVisualIndexHidden(first, secondHidden);
        d->setVisualIndexHidden(second, firstHidden);
    }

    d->viewport->update();
    emit sectionMoved(firstLogical, first, second);
    emit sectionMoved(secondLogical, second, first);

    if (stretchLastSection()) {
        const int lastSectionVisualIdx = visualIndex(d->lastSectionLogicalIdx);
        if (first >= lastSectionVisualIdx || second >= lastSectionVisualIdx)
            d->maybeRestorePrevLastSectionAndStretchLast();
    }
}